

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sxmlc.c
# Opt level: O0

SXML_CHAR * str2html(SXML_CHAR *str,SXML_CHAR *html)

{
  int iVar1;
  int local_34;
  char *pcStack_30;
  int i;
  SXML_CHAR *pd;
  SXML_CHAR *ps;
  SXML_CHAR *html_local;
  SXML_CHAR *str_local;
  
  if (str == (SXML_CHAR *)0x0) {
    str_local = (SXML_CHAR *)0x0;
  }
  else if (html == str) {
    str_local = (SXML_CHAR *)0x0;
  }
  else {
    ps = html;
    if (html == (SXML_CHAR *)0x0) {
      iVar1 = strlen_html(str);
      ps = (SXML_CHAR *)malloc((long)iVar1);
      if (ps == (SXML_CHAR *)0x0) {
        return (SXML_CHAR *)0x0;
      }
    }
    pcStack_30 = ps;
    for (pd = str; *pd != '\0'; pd = pd + 1) {
      local_34 = 0;
      while (HTML_SPECIAL_DICT[local_34].chr != '\0') {
        if (*pd == HTML_SPECIAL_DICT[local_34].chr) {
          strcpy(pcStack_30,HTML_SPECIAL_DICT[local_34].html);
          pcStack_30 = pcStack_30 + (HTML_SPECIAL_DICT[local_34].html_len + -1);
          break;
        }
        local_34 = local_34 + 1;
      }
      if ((HTML_SPECIAL_DICT[local_34].chr == '\0') && (pcStack_30 != pd)) {
        *pcStack_30 = *pd;
      }
      pcStack_30 = pcStack_30 + 1;
    }
    *pcStack_30 = '\0';
    str_local = ps;
  }
  return str_local;
}

Assistant:

SXML_CHAR* str2html(SXML_CHAR* str, SXML_CHAR* html)
{
	SXML_CHAR *ps, *pd;
	int i;

	if (str == NULL)
		return NULL;

	if (html == str) /* Not handled (yet) */
		return NULL;

	if (html == NULL) { /* Allocate 'html' to the correct size */
		html = __malloc(strlen_html(str) * sizeof(SXML_CHAR));
		if (html == NULL)
			return NULL;
	}

	for (ps = str, pd = html; *ps; ps++, pd++) {
		for (i = 0; HTML_SPECIAL_DICT[i].chr; i++) {
			if (*ps == HTML_SPECIAL_DICT[i].chr) {
				sx_strcpy(pd, HTML_SPECIAL_DICT[i].html);
				pd += HTML_SPECIAL_DICT[i].html_len - 1;
				break;
			}
		}
		if (HTML_SPECIAL_DICT[i].chr == NULC && pd != ps)
			*pd = *ps;
	}
	*pd = NULC;

	return html;
}